

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  iVar8 = 1 << ((char)bit - 1U & 0x1f);
  iVar9 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar7 = 0x8000;
  if (0xf < iVar9) {
    iVar7 = 1 << ((char)iVar9 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)(&DAT_00431cc0 + (long)bit * 0x20);
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar10._16_4_ = uVar1;
  auVar10._20_4_ = uVar1;
  auVar10._24_4_ = uVar1;
  auVar10._28_4_ = uVar1;
  auVar12._4_4_ = iVar8;
  auVar12._0_4_ = iVar8;
  auVar12._8_4_ = iVar8;
  auVar12._12_4_ = iVar8;
  auVar12._16_4_ = iVar8;
  auVar12._20_4_ = iVar8;
  auVar12._24_4_ = iVar8;
  auVar12._28_4_ = iVar8;
  auVar10 = vpmulld_avx2(auVar10,(undefined1  [32])*in);
  auVar10 = vpaddd_avx2(auVar10,auVar12);
  auVar10 = vpsrad_avx2(auVar10,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar7 = 10;
    if (10 < bd) {
      iVar7 = bd;
    }
    iVar7 = 0x20 << ((byte)iVar7 & 0x1f);
    iVar8 = -iVar7;
    auVar11._4_4_ = iVar8;
    auVar11._0_4_ = iVar8;
    auVar11._8_4_ = iVar8;
    auVar11._12_4_ = iVar8;
    auVar11._16_4_ = iVar8;
    auVar11._20_4_ = iVar8;
    auVar11._24_4_ = iVar8;
    auVar11._28_4_ = iVar8;
    iVar7 = iVar7 + -1;
    auVar13._4_4_ = iVar7;
    auVar13._0_4_ = iVar7;
    auVar13._8_4_ = iVar7;
    auVar13._12_4_ = iVar7;
    auVar13._16_4_ = iVar7;
    auVar13._20_4_ = iVar7;
    auVar13._24_4_ = iVar7;
    auVar13._28_4_ = iVar7;
    iVar7 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar14._4_4_ = iVar7;
    auVar14._0_4_ = iVar7;
    auVar14._8_4_ = iVar7;
    auVar14._12_4_ = iVar7;
    auVar14._16_4_ = iVar7;
    auVar14._20_4_ = iVar7;
    auVar14._24_4_ = iVar7;
    auVar14._28_4_ = iVar7;
    auVar10 = vpaddd_avx2(auVar10,auVar14);
    auVar10 = vpsrad_avx2(auVar10,ZEXT416((uint)out_shift));
  }
  else {
    iVar8 = -iVar7;
    iVar7 = iVar7 + -1;
    auVar11._4_4_ = iVar8;
    auVar11._0_4_ = iVar8;
    auVar11._8_4_ = iVar8;
    auVar11._12_4_ = iVar8;
    auVar11._16_4_ = iVar8;
    auVar11._20_4_ = iVar8;
    auVar11._24_4_ = iVar8;
    auVar11._28_4_ = iVar8;
    auVar13._4_4_ = iVar7;
    auVar13._0_4_ = iVar7;
    auVar13._8_4_ = iVar7;
    auVar13._12_4_ = iVar7;
    auVar13._16_4_ = iVar7;
    auVar13._20_4_ = iVar7;
    auVar13._24_4_ = iVar7;
    auVar13._28_4_ = iVar7;
  }
  auVar10 = vpmaxsd_avx2(auVar10,auVar11);
  alVar2 = (__m256i)vpminsd_avx2(auVar10,auVar13);
  *in = alVar2;
  *out = alVar2;
  lVar3 = (*in)[0];
  lVar4 = (*in)[1];
  lVar5 = (*in)[2];
  lVar6 = (*in)[3];
  out[1][0] = lVar3;
  out[1][1] = lVar4;
  out[1][2] = lVar5;
  out[1][3] = lVar6;
  out[2][0] = lVar3;
  out[2][1] = lVar4;
  out[2][2] = lVar5;
  out[2][3] = lVar6;
  lVar3 = (*in)[0];
  lVar4 = (*in)[1];
  lVar5 = (*in)[2];
  lVar6 = (*in)[3];
  out[3][0] = lVar3;
  out[3][1] = lVar4;
  out[3][2] = lVar5;
  out[3][3] = lVar6;
  out[4][0] = lVar3;
  out[4][1] = lVar4;
  out[4][2] = lVar5;
  out[4][3] = lVar6;
  lVar3 = (*in)[0];
  lVar4 = (*in)[1];
  lVar5 = (*in)[2];
  lVar6 = (*in)[3];
  out[5][0] = lVar3;
  out[5][1] = lVar4;
  out[5][2] = lVar5;
  out[5][3] = lVar6;
  out[6][0] = lVar3;
  out[6][1] = lVar4;
  out[6][2] = lVar5;
  out[6][3] = lVar6;
  lVar3 = (*in)[0];
  lVar4 = (*in)[1];
  lVar5 = (*in)[2];
  lVar6 = (*in)[3];
  out[7][0] = lVar3;
  out[7][1] = lVar4;
  out[7][2] = lVar5;
  out[7][3] = lVar6;
  out[8][0] = lVar3;
  out[8][1] = lVar4;
  out[8][2] = lVar5;
  out[8][3] = lVar6;
  lVar3 = (*in)[0];
  lVar4 = (*in)[1];
  lVar5 = (*in)[2];
  lVar6 = (*in)[3];
  out[9][0] = lVar3;
  out[9][1] = lVar4;
  out[9][2] = lVar5;
  out[9][3] = lVar6;
  out[10][0] = lVar3;
  out[10][1] = lVar4;
  out[10][2] = lVar5;
  out[10][3] = lVar6;
  lVar3 = (*in)[0];
  lVar4 = (*in)[1];
  lVar5 = (*in)[2];
  lVar6 = (*in)[3];
  out[0xb][0] = lVar3;
  out[0xb][1] = lVar4;
  out[0xb][2] = lVar5;
  out[0xb][3] = lVar6;
  out[0xc][0] = lVar3;
  out[0xc][1] = lVar4;
  out[0xc][2] = lVar5;
  out[0xc][3] = lVar6;
  lVar3 = (*in)[0];
  lVar4 = (*in)[1];
  lVar5 = (*in)[2];
  lVar6 = (*in)[3];
  out[0xd][0] = lVar3;
  out[0xd][1] = lVar4;
  out[0xd][2] = lVar5;
  out[0xd][3] = lVar6;
  out[0xe][0] = lVar3;
  out[0xe][1] = lVar4;
  out[0xe][2] = lVar5;
  out[0xe][3] = lVar6;
  lVar3 = (*in)[1];
  lVar4 = (*in)[2];
  lVar5 = (*in)[3];
  out[0xf][0] = (*in)[0];
  out[0xf][1] = lVar3;
  out[0xf][2] = lVar4;
  out[0xf][3] = lVar5;
  return;
}

Assistant:

static void idct16_low1_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  // stage 1
  __m256i x1[2];
  x1[0] = input[0];

  // stage 2
  // stage 3
  // stage 4
  btf_16_w16_0_avx2(cospi[32], cospi[32], x1[0], x1[0], x1[1]);

  // stage 5
  // stage 6
  output[0] = x1[0];
  output[1] = x1[1];
  output[2] = x1[1];
  output[3] = x1[0];
  output[4] = x1[0];
  output[5] = x1[1];
  output[6] = x1[1];
  output[7] = x1[0];
  output[8] = x1[0];
  output[9] = x1[1];
  output[10] = x1[1];
  output[11] = x1[0];
  output[12] = x1[0];
  output[13] = x1[1];
  output[14] = x1[1];
  output[15] = x1[0];
}